

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O3

void __thiscall qpdf::Tokenizer::inTop(Tokenizer *this,char ch)

{
  int iVar1;
  undefined7 in_register_00000031;
  
  iVar1 = (int)CONCAT71(in_register_00000031,ch);
  if (iVar1 < 0x5b) {
    switch(iVar1) {
    case 0x28:
      this->string_depth = 1;
      this->state = st_in_string;
      break;
    case 0x29:
      this->type = tt_bad;
      std::__cxx11::string::_M_replace
                ((ulong)&this->error_message,0,(char *)(this->error_message)._M_string_length,
                 0x27a382);
      goto LAB_001e19ef;
    default:
switchD_001e1925_caseD_2a:
      this->state = st_literal;
      break;
    case 0x2b:
    case 0x2d:
      this->state = st_sign;
      break;
    case 0x2e:
      this->state = st_decimal;
      break;
    case 0x2f:
      this->state = st_name;
      std::__cxx11::string::push_back((char)this + '\x10');
      return;
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      this->state = st_number;
      break;
    case 0x3c:
      this->state = st_lt;
      break;
    case 0x3e:
      this->state = st_gt;
    }
  }
  else {
    if (iVar1 < 0x7b) {
      if (iVar1 == 0x5b) {
        this->type = tt_array_open;
      }
      else {
        if (iVar1 != 0x5d) goto switchD_001e1925_caseD_2a;
        this->type = tt_array_close;
      }
    }
    else if (iVar1 == 0x7b) {
      this->type = tt_brace_open;
    }
    else {
      if (iVar1 != 0x7d) goto switchD_001e1925_caseD_2a;
      this->type = tt_brace_close;
    }
LAB_001e19ef:
    this->state = st_token_ready;
  }
  return;
}

Assistant:

void
Tokenizer::inTop(char ch)
{
    switch (ch) {
    case '(':
        string_depth = 1;
        state = st_in_string;
        return;

    case '<':
        state = st_lt;
        return;

    case '>':
        state = st_gt;
        return;

    case (')'):
        type = tt::tt_bad;
        QTC::TC("qpdf", "QPDFTokenizer bad )");
        error_message = "unexpected )";
        state = st_token_ready;
        return;

    case '[':
        type = tt::tt_array_open;
        state = st_token_ready;
        return;

    case ']':
        type = tt::tt_array_close;
        state = st_token_ready;
        return;

    case '{':
        type = tt::tt_brace_open;
        state = st_token_ready;
        return;

    case '}':
        type = tt::tt_brace_close;
        state = st_token_ready;
        return;

    case '/':
        state = st_name;
        val += ch;
        return;

    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
        state = st_number;
        return;

    case '+':
    case '-':
        state = st_sign;
        return;

    case '.':
        state = st_decimal;
        return;

    default:
        state = st_literal;
        return;
    }
}